

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

void __thiscall QFileDialogPrivate::nativeEnterDirectory(QFileDialogPrivate *this,QUrl *directory)

{
  long lVar1;
  QFileDialog *_t1;
  ulong uVar2;
  Type *this_00;
  QFileDialog *in_RSI;
  QFileDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  QFileDialog *q;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_lastVisitedDir>_>
  *in_stack_ffffffffffffffb8;
  QFileDialog *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _t1 = q_func(in_RDI);
  QFileDialog::directoryUrlEntered(in_stack_ffffffffffffffc0,(QUrl *)in_stack_ffffffffffffffb8);
  uVar2 = QUrl::isEmpty();
  if ((uVar2 & 1) == 0) {
    this_00 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_lastVisitedDir>_>::
              operator()(in_stack_ffffffffffffffb8);
    QUrl::operator=(this_00,(QUrl *)in_RSI);
    uVar2 = QUrl::isLocalFile();
    if ((uVar2 & 1) != 0) {
      QUrl::toLocalFile();
      QFileDialog::directoryEntered(in_RSI,(QString *)_t1);
      QString::~QString((QString *)0x74ea9f);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileDialogPrivate::nativeEnterDirectory(const QUrl &directory)
{
    Q_Q(QFileDialog);
    emit q->directoryUrlEntered(directory);
    if (!directory.isEmpty()) { // Windows native dialogs occasionally emit signals with empty strings.
        *lastVisitedDir() = directory;
        if (directory.isLocalFile())
            emit q->directoryEntered(directory.toLocalFile());
    }
}